

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it;
  const_iterator f;
  const_iterator l;
  int *piVar1;
  bool bVar2;
  reference ppVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> _Var7;
  value_type vVar8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> _Var9;
  value_type vVar10;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> _Var11;
  value_type vVar12;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> _Var13;
  value_type vVar14;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> _Var15;
  value_type vVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  pair<std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>,_bool> pVar23;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  const_iterator set_end;
  const_iterator set_begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator begin;
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  set_input;
  value_type input [4];
  TypeParam ht_source;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4a8;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  allocator_type *in_stack_fffffffffffff4b0;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  key_equal *in_stack_fffffffffffff4b8;
  hasher *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 uVar24;
  undefined4 in_stack_fffffffffffff4cc;
  int iVar25;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff4d0;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *__i;
  Type type;
  AssertHelper *this_02;
  undefined8 in_stack_fffffffffffff4f8;
  nonempty_iterator in_stack_fffffffffffff500;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff508;
  _Base_ptr expected_predicate_value;
  char *actual_predicate_value;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *expression_text;
  AssertionResult *assertion_result;
  AssertHelper *this_03;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff550;
  bool local_a39;
  value_type *in_stack_fffffffffffff5e8;
  undefined7 in_stack_fffffffffffff5f0;
  undefined1 in_stack_fffffffffffff5f7;
  undefined7 in_stack_fffffffffffff608;
  undefined7 in_stack_fffffffffffff620;
  undefined7 in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff650;
  undefined7 in_stack_fffffffffffff668;
  value_type *pvVar26;
  const_nonempty_iterator ppVar27;
  AssertionResult local_8c8 [2];
  size_type local_8a8;
  undefined4 local_89c;
  AssertionResult local_898;
  _Base_ptr local_888;
  _Base_ptr local_880;
  _Base_ptr local_878;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_870;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_868;
  string local_860 [48];
  value_type local_830 [11];
  value_type local_7d8 [11];
  value_type local_780 [11];
  value_type local_728 [11];
  value_type local_6d0 [11];
  value_type local_678 [11];
  bool local_619;
  AssertionResult local_618 [2];
  size_type local_5f8;
  undefined4 local_5ec;
  AssertionResult local_5e8;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_5d8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_5d0;
  _Base_ptr local_5c8;
  _Base_ptr p_Stack_5c0;
  char *local_5b8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *p_Stack_5b0;
  AssertionResult *local_5a8;
  AssertHelper *pAStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_588;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_580;
  _Base_ptr local_578;
  _Base_ptr p_Stack_570;
  char *local_568;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *p_Stack_560;
  AssertionResult *local_558;
  AssertHelper *pAStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_538;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_530;
  _Base_ptr local_528;
  _Base_ptr p_Stack_520;
  char *local_518;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *p_Stack_510;
  AssertionResult *local_508;
  AssertHelper *pAStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  const_iterator *pcStack_4e0;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  const_iterator *pcStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_498;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_490;
  _Base_ptr local_488;
  _Base_ptr p_Stack_480;
  char *local_478;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> *p_Stack_470;
  AssertionResult *local_468;
  AssertHelper *pAStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  _Base_ptr local_448;
  undefined1 local_440;
  value_type local_438;
  _Base_ptr local_430;
  undefined1 local_428;
  value_type local_420;
  _Base_ptr local_418;
  undefined1 local_410;
  value_type local_408;
  _Base_ptr local_400;
  undefined1 local_3f8;
  value_type local_3f0;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  value_type local_3d8;
  _Base_ptr local_3d0;
  undefined1 local_3c8;
  value_type local_3c0;
  pair<const_int,_int> local_338;
  value_type local_330;
  pair<const_int,_int> local_328;
  value_type local_320 [12];
  value_type local_2c0;
  value_type local_260;
  value_type local_200;
  value_type local_1a0;
  value_type local_140;
  value_type local_dc;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  Hasher local_b8;
  Hasher local_ac [14];
  
  Hasher::Hasher(local_ac,0);
  Hasher::Hasher(&local_b8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            (in_stack_fffffffffffff4d0,CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8)
             ,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
  local_dc = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  local_140 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  local_1a0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  local_200 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  local_260 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  local_2c0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
           in_stack_fffffffffffff5e8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff550);
  ppVar3 = google::
           sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xe3a061);
  local_338 = *ppVar3;
  local_330 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff4a8,0);
  ppVar27 = &local_328;
  vVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff4a8,0);
  iVar25 = vVar4.second;
  piVar1 = &ppVar27->second;
  ppVar27->first = vVar4.first;
  *piVar1 = iVar25;
  pvVar26 = local_320;
  vVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff4a8,0);
  *pvVar26 = vVar5;
  std::
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  ::set((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
         *)0xe3a148);
  vVar6 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_3c0 = vVar6;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  _Var7 = pVar23.first._M_node;
  uVar17 = pVar23.second;
  local_3d0 = _Var7._M_node;
  local_3c8 = uVar17;
  vVar8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_3d8 = vVar8;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  _Var9 = pVar23.first._M_node;
  uVar18 = pVar23.second;
  local_3e8 = _Var9._M_node;
  local_3e0 = uVar18;
  vVar10 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_3f0 = vVar10;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  _Var11 = pVar23.first._M_node;
  uVar19 = pVar23.second;
  local_400 = _Var11._M_node;
  local_3f8 = uVar19;
  vVar12 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_408 = vVar12;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  _Var13 = pVar23.first._M_node;
  uVar20 = pVar23.second;
  local_418 = _Var13._M_node;
  local_410 = uVar20;
  vVar14 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_420 = vVar14;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  _Var15 = pVar23.first._M_node;
  uVar21 = pVar23.second;
  local_430 = _Var15._M_node;
  local_428 = uVar21;
  vVar16 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff4a8,0);
  local_438 = vVar16;
  pVar23 = std::
           set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
           ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)in_stack_fffffffffffff4d0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
  local_448 = (_Base_ptr)pVar23.first._M_node;
  uVar22 = pVar23.second;
  local_440 = uVar22;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff550);
  iVar25 = (int)((ulong)local_4c8 >> 0x20);
  it.super_iterator.pos.row_begin._M_current._0_4_ = (int)local_4c8;
  it.super_iterator.ht =
       (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_4d0;
  it.super_iterator.pos.row_begin._M_current._4_4_ = iVar25;
  it.super_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_4c0;
  it.super_iterator.pos.row_current._M_current._0_4_ = (int)local_4b8;
  it.super_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_4b8 >> 0x20);
  it.super_iterator.pos.col_current = (nonempty_iterator)uStack_4b0;
  it.super_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)local_4a8;
  it.super_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_4a0;
  it.super_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff4f8;
  it.super_iterator.end.col_current = in_stack_fffffffffffff500;
  it.parent_ = in_stack_fffffffffffff508;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_4e0,it);
  local_4f8 = local_458;
  uStack_4f0 = uStack_450;
  local_508 = local_468;
  pAStack_500 = pAStack_460;
  local_518 = local_478;
  p_Stack_510 = p_Stack_470;
  local_528 = local_488;
  p_Stack_520 = p_Stack_480;
  local_538 = local_498;
  pBStack_530 = pBStack_490;
  std::
  advance<google::BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator,int>
            (pcStack_4c0,iVar25);
  local_548 = local_458;
  uStack_540 = uStack_450;
  local_558 = local_468;
  pAStack_550 = pAStack_460;
  local_568 = local_478;
  p_Stack_560 = p_Stack_470;
  local_578 = local_488;
  p_Stack_570 = p_Stack_480;
  local_588 = local_498;
  pBStack_580 = pBStack_490;
  local_598 = local_4f8;
  uStack_590 = uStack_4f0;
  local_5a8 = local_508;
  pAStack_5a0 = pAStack_500;
  local_5b8 = local_518;
  p_Stack_5b0 = p_Stack_510;
  local_5c8 = local_528;
  p_Stack_5c0 = p_Stack_520;
  local_5d8 = local_538;
  pBStack_5d0 = pBStack_530;
  type = (Type)((ulong)local_468 >> 0x20);
  uVar24 = SUB84(local_478,0);
  iVar25 = (int)((ulong)local_478 >> 0x20);
  f.super_const_iterator.pos.row_begin._M_current._0_7_ = in_stack_fffffffffffff608;
  f.super_const_iterator.ht =
       (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)vVar16;
  f.super_const_iterator.pos.row_begin._M_current._7_1_ = uVar21;
  f.super_const_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)_Var15._M_node;
  f.super_const_iterator.pos.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)vVar14;
  f.super_const_iterator.pos.col_current._0_7_ = in_stack_fffffffffffff620;
  f.super_const_iterator.pos.col_current._7_1_ = uVar20;
  f.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)_Var13._M_node;
  f.super_const_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)vVar12;
  f.super_const_iterator.end.row_current._M_current._0_7_ = in_stack_fffffffffffff638;
  f.super_const_iterator.end.row_current._M_current._7_1_ = uVar19;
  f.super_const_iterator.end.col_current = (const_nonempty_iterator)_Var11._M_node;
  f.parent_ = (BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)vVar10;
  l.super_const_iterator.ht._7_1_ = uVar18;
  l.super_const_iterator.ht._0_7_ = in_stack_fffffffffffff650;
  l.super_const_iterator.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)_Var9._M_node;
  l.super_const_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)vVar8;
  l.super_const_iterator.pos.row_current._M_current._0_7_ = in_stack_fffffffffffff668;
  l.super_const_iterator.pos.row_current._M_current._7_1_ = uVar17;
  l.super_const_iterator.pos.col_current = (const_nonempty_iterator)_Var7._M_node;
  l.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)vVar6;
  l.super_const_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)pvVar26;
  l.super_const_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)vVar5;
  l.super_const_iterator.end.col_current = ppVar27;
  l.parent_ = (BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)vVar4;
  expected_predicate_value = p_Stack_520;
  actual_predicate_value = local_518;
  expression_text = p_Stack_510;
  assertion_result = local_508;
  this_03 = pAStack_500;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::
  insert<google::BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            ((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT17(uVar22,in_stack_fffffffffffff5f0),f,l);
  local_5ec = 3;
  local_5f8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe3a607);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)p_Stack_480,&local_488->_M_color,
             (unsigned_long *)pBStack_490);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5e8);
  this_00 = local_498;
  this_01 = pBStack_490;
  _Var7._M_node = local_488;
  _Var9._M_node = p_Stack_480;
  __i = p_Stack_470;
  this_02 = pAStack_460;
  if (!bVar2) {
    testing::Message::Message((Message *)pAStack_460);
    testing::AssertionResult::failure_message((AssertionResult *)0xe3a6da);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_460,type,(char *)p_Stack_470,iVar25,(char *)p_Stack_480);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pBStack_490);
    testing::Message::~Message((Message *)0xe3a73d);
    this_00 = local_498;
    this_01 = pBStack_490;
    _Var7._M_node = local_488;
    _Var9._M_node = p_Stack_480;
    __i = p_Stack_470;
    this_02 = pAStack_460;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe3a7ae);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff550);
  ppVar3 = google::
           sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xe3a7d6);
  local_678[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(this_00,0);
  bVar2 = std::operator==(ppVar3,local_678);
  local_a39 = true;
  if (!bVar2) {
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::begin(in_stack_fffffffffffff550);
    ppVar3 = google::
             sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0xe3a85d);
    local_6d0[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::UniqueObject(this_00,0);
    bVar2 = std::operator==(ppVar3,local_6d0);
    local_a39 = true;
    if (!bVar2) {
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::begin(in_stack_fffffffffffff550);
      ppVar3 = google::
               sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)0xe3a8e4);
      local_728[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     ::UniqueObject(this_00,0);
      bVar2 = std::operator==(ppVar3,local_728);
      local_a39 = true;
      if (!bVar2) {
        google::
        BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::begin(in_stack_fffffffffffff550);
        ppVar3 = google::
                 sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                              *)0xe3a96b);
        local_780[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ::UniqueObject(this_00,0);
        bVar2 = std::operator==(ppVar3,local_780);
        local_a39 = true;
        if (!bVar2) {
          google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::begin(in_stack_fffffffffffff550);
          ppVar3 = google::
                   sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)0xe3a9f2);
          local_7d8[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         ::UniqueObject(this_00,0);
          bVar2 = std::operator==(ppVar3,local_7d8);
          local_a39 = true;
          if (!bVar2) {
            google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::begin(in_stack_fffffffffffff550);
            ppVar3 = google::
                     sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                  *)0xe3aa75);
            local_830[0] = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           ::UniqueObject(this_00,0);
            local_a39 = std::operator==(ppVar3,local_830);
          }
        }
      }
    }
  }
  local_619 = local_a39;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0xe3aaf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text,actual_predicate_value,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var9._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_860);
    testing::Message::~Message((Message *)0xe3abc5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe3ac5c);
  std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator(&local_868);
  std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator(&local_870);
  local_878 = (_Base_ptr)
              std::
              set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
              ::begin((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)this_00);
  local_870._M_node = local_878;
  local_868._M_node = local_878;
  std::advance<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,int>(__i,iVar25);
  local_880 = local_868._M_node;
  local_888 = local_870._M_node;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>(this_01,_Var9,_Var7);
  local_89c = 6;
  local_8a8 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe3ad26);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)_Var9._M_node,&(_Var7._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe3adb3);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var9._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe3ae16);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe3ae87);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::pair<int_const,int>const*>
            (this_01,(pair<const_int,_int> *)this_00,(pair<const_int,_int> *)0xe3aea8);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe3aec6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)_Var9._M_node,&(_Var7._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_8c8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe3af53);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var9._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe3afb6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe3b021);
  std::
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~set((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          *)0xe3b02e);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xe3b03b);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}